

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsTorqueBase.cpp
# Opt level: O3

void __thiscall
chrono::ChShaftsTorqueBase::IntLoadResidual_F
          (ChShaftsTorqueBase *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChShaft *pCVar3;
  double *pdVar4;
  int iVar5;
  ulong uVar6;
  undefined4 in_register_00000034;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  pCVar3 = (this->super_ChShaftsCouple).shaft1;
  iVar5 = (*(pCVar3->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])
                    (pCVar3,CONCAT44(in_register_00000034,off));
  if ((char)iVar5 != '\0') {
    uVar6 = (ulong)(((this->super_ChShaftsCouple).shaft1)->super_ChPhysicsItem).offset_w;
    if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar6) goto LAB_005dca3f;
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = this->torque;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = c;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pdVar4[uVar6];
    auVar1 = vfmadd213sd_fma(auVar7,auVar9,auVar1);
    pdVar4[uVar6] = auVar1._0_8_;
  }
  iVar5 = (*(((this->super_ChShaftsCouple).shaft2)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])
                    ();
  if ((char)iVar5 != '\0') {
    uVar6 = (ulong)(((this->super_ChShaftsCouple).shaft2)->super_ChPhysicsItem).offset_w;
    if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <=
        (long)uVar6) {
LAB_005dca3f:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                   );
    }
    pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = this->torque;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = c;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pdVar4[uVar6];
    auVar1 = vfnmadd213sd_fma(auVar10,auVar8,auVar2);
    pdVar4[uVar6] = auVar1._0_8_;
  }
  return;
}

Assistant:

void ChShaftsTorqueBase::IntLoadResidual_F(const unsigned int off,  // offset in R residual
                                           ChVectorDynamic<>& R,    // result: the R residual, R += c*F
                                           const double c           // a scaling factor
                                           ) {
    if (shaft1->IsActive())
        R(shaft1->GetOffset_w()) += torque * c;
    if (shaft2->IsActive())
        R(shaft2->GetOffset_w()) += -torque * c;
}